

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerSession.cpp
# Opt level: O2

void __thiscall ki::protocol::net::ServerSession::on_keep_alive(ServerSession *this)

{
  _func_int **pp_Var1;
  undefined8 uVar2;
  undefined1 local_30 [16];
  ClientKeepAlive keep_alive;
  
  control::ClientKeepAlive::ClientKeepAlive(&keep_alive,0,0,0);
  Session::read_data<ki::protocol::control::ClientKeepAlive>((Session *)local_30);
  keep_alive.m_minutes = local_30._12_2_;
  keep_alive.m_session_id = local_30._8_2_;
  keep_alive.m_milliseconds = local_30._10_2_;
  uVar2 = std::chrono::_V2::steady_clock::now();
  pp_Var1 = this->_vptr_ServerSession;
  *(undefined8 *)(&this->field_0x28 + (long)pp_Var1[-3]) = uVar2;
  Session::send_packet
            ((Session *)((long)&this->_vptr_ServerSession + (long)pp_Var1[-3]),true,'\x04',
             &keep_alive.super_Serializable);
  return;
}

Assistant:

void ServerSession::on_keep_alive()
	{
		// Read the payload data into a structure
		control::ClientKeepAlive keep_alive;
		try
		{
			keep_alive = read_data<control::ClientKeepAlive>();
		}
		catch (parse_error &e)
		{
			// The KEEP_ALIVE wasn't valid...
			// Close the session
			close(SessionCloseErrorCode::INVALID_MESSAGE);
			return;
		}

		// Send the response
		m_last_received_heartbeat_time = std::chrono::steady_clock::now();
		send_packet(true, (uint8_t)control::Opcode::KEEP_ALIVE_RSP, keep_alive);
	}